

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O2

void Aig_TableProfile(Aig_Man_t *p)

{
  Aig_Obj_t *pAVar1;
  int iVar2;
  long lVar3;
  
  printf("Table size = %d. Entries = %d.\n",(ulong)(uint)p->nTableSize,
         (ulong)(uint)(p->nObjs[6] + p->nObjs[5]));
  for (lVar3 = 0; lVar3 < p->nTableSize; lVar3 = lVar3 + 1) {
    pAVar1 = (Aig_Obj_t *)(p->pTable + lVar3);
    iVar2 = -1;
    do {
      pAVar1 = *(Aig_Obj_t **)&pAVar1->field_0;
      iVar2 = iVar2 + 1;
    } while (pAVar1 != (Aig_Obj_t *)0x0);
    if (iVar2 != 0) {
      printf("%d ");
    }
  }
  return;
}

Assistant:

void Aig_TableProfile( Aig_Man_t * p )
{
    Aig_Obj_t * pEntry;
    int i, Counter;
    printf( "Table size = %d. Entries = %d.\n", p->nTableSize, Aig_ManNodeNum(p) );
    for ( i = 0; i < p->nTableSize; i++ )
    {
        Counter = 0;
        for ( pEntry = p->pTable[i]; pEntry; pEntry = pEntry->pNext )
            Counter++;
        if ( Counter ) 
            printf( "%d ", Counter );
    }
}